

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O3

FT_Error af_glyph_hints_reload(AF_GlyphHints hints,FT_Outline *outline)

{
  char cVar1;
  short sVar2;
  int iVar3;
  FT_Memory memory;
  FT_Fixed FVar4;
  FT_Fixed FVar5;
  FT_Vector *pFVar6;
  FT_Pos FVar7;
  FT_Pos FVar8;
  ushort uVar9;
  FT_Orientation FVar10;
  uint uVar11;
  AF_Point_conflict *ppAVar12;
  AF_Point_conflict pAVar13;
  AF_Point pAVar14;
  AF_Point_conflict pAVar15;
  AF_Point_conflict *ppAVar16;
  long lVar17;
  byte bVar18;
  short *psVar19;
  long lVar20;
  long lVar21;
  FT_Vector *pFVar22;
  long lVar23;
  short sVar24;
  long lVar25;
  byte *pbVar26;
  FT_UShort FVar27;
  uint uVar28;
  AF_Point_conflict pAVar29;
  int iVar30;
  AF_Point pAVar31;
  uint uVar32;
  FT_Int FVar33;
  uint uVar34;
  AF_Point_conflict pAVar35;
  long lVar36;
  AF_Point_conflict pAVar37;
  bool bVar38;
  FT_Error error;
  FT_Error local_7c;
  FT_Outline *local_78;
  AF_Point_conflict local_70;
  AF_Point_conflict *local_68;
  AF_Point_conflict *local_60;
  AF_Point_conflict local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_7c = 0;
  memory = hints->memory;
  FVar4 = hints->x_scale;
  FVar5 = hints->y_scale;
  local_60 = (AF_Point_conflict *)hints->x_delta;
  local_68 = (AF_Point_conflict *)hints->y_delta;
  hints->num_points = 0;
  hints->num_contours = 0;
  hints->axis[0].num_segments = 0;
  hints->axis[0].num_edges = 0;
  hints->axis[1].num_segments = 0;
  hints->axis[1].num_edges = 0;
  uVar32 = (uint)outline->n_contours;
  local_78 = outline;
  if (uVar32 < 9) {
    if (hints->contours != (AF_Point_conflict *)0x0) goto LAB_0017fb9f;
    hints->contours = (hints->embedded).contours;
    uVar32 = 8;
  }
  else {
    if (uVar32 <= (uint)hints->max_contours) goto LAB_0017fb9f;
    ppAVar12 = hints->contours;
    if ((anon_struct_7744_2_b586ae8f_for_embedded *)ppAVar12 == &hints->embedded) {
      hints->contours = (AF_Point_conflict *)0x0;
      ppAVar12 = (AF_Point_conflict *)0x0;
    }
    uVar32 = uVar32 + 3 & 0xfffffffc;
    ppAVar12 = (AF_Point_conflict *)
               ft_mem_realloc(memory,8,(ulong)(uint)hints->max_contours,(ulong)uVar32,ppAVar12,
                              &local_7c);
    hints->contours = ppAVar12;
    if (local_7c != 0) {
      return local_7c;
    }
  }
  hints->max_contours = uVar32;
LAB_0017fb9f:
  FVar33 = (FT_Int)local_78->n_points;
  if (FVar33 + 2U < 0x61) {
    if (hints->points == (AF_Point_conflict)0x0) {
      hints->points = (hints->embedded).points;
      hints->max_points = 0x60;
    }
  }
  else if ((uint)hints->max_points < FVar33 + 2U) {
    pAVar13 = hints->points;
    if (pAVar13 == (hints->embedded).points) {
      hints->points = (AF_Point_conflict)0x0;
      pAVar13 = (AF_Point_conflict)0x0;
    }
    uVar32 = FVar33 + 0xbU & 0xfffffff8;
    pAVar13 = (AF_Point_conflict)
              ft_mem_realloc(memory,0x50,(ulong)(uint)hints->max_points,(ulong)uVar32,pAVar13,
                             &local_7c);
    hints->points = pAVar13;
    if (local_7c != 0) {
      return local_7c;
    }
    hints->max_points = uVar32;
    FVar33 = (FT_Int)local_78->n_points;
  }
  hints->num_points = FVar33;
  hints->num_contours = (int)local_78->n_contours;
  hints->axis[0].major_dir = AF_DIR_UP;
  hints->axis[1].major_dir = AF_DIR_LEFT;
  FVar10 = FT_Outline_Get_Orientation(local_78);
  if (FVar10 == FT_ORIENTATION_FILL_LEFT) {
    hints->axis[0].major_dir = AF_DIR_DOWN;
    hints->axis[1].major_dir = AF_DIR_RIGHT;
  }
  hints->x_scale = FVar4;
  hints->y_scale = FVar5;
  hints->x_delta = (FT_Pos)local_60;
  hints->y_delta = (FT_Pos)local_68;
  hints->xmin_delta = 0;
  hints->xmax_delta = 0;
  iVar3 = hints->num_points;
  local_48 = (long)iVar3;
  if (local_48 != 0) {
    pAVar13 = hints->points;
    pAVar29 = pAVar13 + local_48;
    uVar32 = (uint)((hints->metrics->scaler).face)->units_per_EM * 0x14 >> 0xb;
    local_50 = (ulong)uVar32;
    psVar19 = local_78->contours;
    if (0 < iVar3) {
      pFVar6 = local_78->points;
      lVar25 = (long)*psVar19;
      pAVar15 = pAVar13 + lVar25;
      pbVar26 = (byte *)local_78->tags;
      local_38 = (long)(int)FVar4;
      local_40 = (long)(int)FVar5;
      iVar30 = 0;
      pFVar22 = pFVar6;
      pAVar35 = pAVar15;
      pAVar37 = pAVar13;
      do {
        pAVar37->in_dir = '\x04';
        pAVar37->out_dir = '\x04';
        FVar7 = pFVar22->x;
        pAVar37->fx = (FT_Short)FVar7;
        FVar8 = pFVar22->y;
        pAVar37->fy = (FT_Short)FVar8;
        lVar21 = (int)FVar7 * local_38;
        lVar21 = (long)(int)((ulong)(lVar21 + 0x8000 + (lVar21 >> 0x3f)) >> 0x10) + (long)local_60;
        pAVar37->x = lVar21;
        pAVar37->ox = lVar21;
        lVar21 = (int)FVar8 * local_40;
        lVar21 = (long)(int)((ulong)(lVar21 + 0x8000 + (lVar21 >> 0x3f)) >> 0x10) + (long)local_68;
        pAVar37->y = lVar21;
        pAVar37->oy = lVar21;
        pAVar15->fx = (FT_Short)pFVar6[(short)lVar25].x;
        pAVar15->fy = (FT_Short)pFVar6[(short)lVar25].y;
        FVar27 = (ushort)((*pbVar26 & 3) == 2) * 2;
        if ((*pbVar26 & 3) == 0) {
          FVar27 = 1;
        }
        pAVar37->flags = FVar27;
        uVar11 = (int)pAVar37->fx - (int)pAVar35->fx;
        uVar34 = -uVar11;
        if (0 < (int)uVar11) {
          uVar34 = uVar11;
        }
        uVar28 = (int)pAVar37->fy - (int)pAVar35->fy;
        uVar11 = -uVar28;
        if (0 < (int)uVar28) {
          uVar11 = uVar28;
        }
        if ((uVar11 & 0xffff) + (uVar34 & 0xffff) < uVar32) {
          *(byte *)&pAVar35->flags = (byte)pAVar35->flags | 0x20;
        }
        pAVar37->prev = pAVar35;
        pAVar35->next = pAVar37;
        pAVar35 = pAVar37;
        if ((pAVar37 == pAVar15) &&
           (iVar30 = iVar30 + 1, pAVar15 = pAVar37, iVar30 < local_78->n_contours)) {
          lVar25 = (long)psVar19[iVar30];
          pAVar15 = pAVar13 + lVar25;
          pAVar35 = pAVar13 + lVar25;
        }
        pAVar37 = pAVar37 + 1;
        pFVar22 = pFVar22 + 1;
        pbVar26 = pbVar26 + 1;
      } while (pAVar37 < pAVar29);
    }
    iVar30 = hints->num_contours;
    lVar25 = (long)iVar30;
    if (0 < lVar25) {
      ppAVar16 = hints->contours;
      ppAVar12 = ppAVar16 + lVar25;
      sVar24 = 0;
      do {
        *ppAVar16 = pAVar13 + sVar24;
        sVar24 = *psVar19 + 1;
        ppAVar16 = ppAVar16 + 1;
        psVar19 = psVar19 + 1;
      } while (ppAVar16 < ppAVar12);
      if (0 < iVar30) {
        local_68 = hints->contours + lVar25;
        ppAVar12 = hints->contours;
        do {
          local_60 = ppAVar12;
          pAVar14 = *local_60;
          do {
            pAVar15 = pAVar14;
            pAVar14 = pAVar15->prev;
            if (pAVar14 == *local_60) {
              uVar34 = (uint)(ushort)pAVar15->fy;
              break;
            }
            lVar21 = (long)pAVar15->fx - (long)pAVar14->fx;
            uVar34 = (uint)pAVar15->fy;
            lVar25 = -lVar21;
            if (0 < lVar21) {
              lVar25 = lVar21;
            }
            uVar28 = uVar34 - (int)pAVar14->fy;
            uVar11 = -uVar28;
            if (0 < (int)uVar28) {
              uVar11 = uVar28;
            }
          } while ((long)(((ulong)uVar11 & 0xffff) + lVar25) < (long)(int)(uVar32 * 2 + -1));
          pAVar15->u = 0;
          pAVar15->v = 0;
          lVar25 = 0;
          lVar21 = 0;
          pAVar14 = pAVar15;
          pAVar31 = pAVar15;
          sVar24 = pAVar15->fx;
          do {
            pAVar14 = pAVar14->next;
            sVar2 = pAVar14->fx;
            lVar25 = ((long)sVar2 - (long)sVar24) + lVar25;
            sVar24 = pAVar14->fy;
            lVar21 = ((long)sVar24 - (long)(short)uVar34) + lVar21;
            lVar23 = -lVar25;
            lVar17 = lVar25;
            if (lVar25 < 1) {
              lVar17 = lVar23;
            }
            lVar36 = lVar21;
            if (lVar21 < 1) {
              lVar36 = -lVar21;
            }
            if ((ulong)(lVar36 + lVar17) < local_50) {
              *(byte *)&pAVar14->flags = (byte)pAVar14->flags | 0x10;
            }
            else {
              lVar20 = (long)pAVar14 - (long)pAVar31 >> 4;
              pAVar31->u = lVar20 * -0x3333333333333333;
              pAVar14->v = lVar20 * 0x3333333333333333;
              if (lVar21 < lVar25) {
                bVar18 = 1;
                lVar20 = lVar25;
                if (SBORROW8(lVar21,lVar23) != lVar21 + lVar25 < 0) {
                  bVar18 = 0xfe;
                  lVar36 = lVar17;
                  lVar20 = -lVar21;
                }
              }
              else {
                bVar38 = -lVar21 != lVar25;
                lVar20 = lVar21;
                if (bVar38 && lVar21 <= lVar23) {
                  lVar25 = lVar21;
                  lVar20 = lVar23;
                }
                bVar18 = -(bVar38 && lVar21 <= lVar23) | 2;
                lVar36 = -lVar25;
                if (0 < lVar25) {
                  lVar36 = lVar25;
                }
              }
              if (lVar20 <= lVar36 * 0xe) {
                bVar18 = 4;
              }
              while( true ) {
                pAVar31->out_dir = bVar18;
                pAVar31 = pAVar31->next;
                if (pAVar31 == pAVar14) break;
                pAVar31->in_dir = bVar18;
              }
              pAVar14->in_dir = bVar18;
              lVar25 = (long)pAVar15 - (long)pAVar31 >> 4;
              pAVar31->u = lVar25 * -0x3333333333333333;
              pAVar15->v = lVar25 * 0x3333333333333333;
              lVar25 = 0;
              lVar21 = 0;
            }
            uVar34 = (uint)sVar24;
            sVar24 = sVar2;
          } while (pAVar14 != pAVar15);
          ppAVar12 = local_60 + 1;
        } while (local_60 + 1 < local_68);
      }
    }
    pAVar15 = pAVar13;
    if (0 < iVar3) {
      do {
        if ((((pAVar15->flags & 0x10) == 0) && (pAVar15->in_dir == '\x04')) &&
           (pAVar15->out_dir == '\x04')) {
          lVar25 = pAVar15->u;
          lVar21 = pAVar15->v;
          if ((-1 < ((int)pAVar15->fx - (int)pAVar15[lVar21].fx ^
                    (int)pAVar15[lVar25].fx - (int)pAVar15->fx)) &&
             (-1 < ((int)pAVar15->fy - (int)pAVar15[lVar21].fy ^
                   (int)pAVar15[lVar25].fy - (int)pAVar15->fy))) {
            pAVar15->flags = pAVar15->flags | 0x10;
            lVar17 = lVar25 * 0x50 + lVar21 * -0x50 >> 4;
            pAVar15[lVar21].u = lVar17 * -0x3333333333333333;
            pAVar15[lVar25].v = lVar17 * 0x3333333333333333;
          }
        }
        pAVar15 = pAVar15 + 1;
      } while (pAVar15 < pAVar29);
      local_70 = pAVar13;
      local_58 = pAVar29;
      if (0 < iVar3) {
        do {
          uVar9 = pAVar13->flags;
          if ((uVar9 & 0x10) == 0) {
            if ((uVar9 & 3) == 0) {
              cVar1 = pAVar13->out_dir;
              if (cVar1 == pAVar13->in_dir) {
                if (cVar1 == '\x04') {
                  lVar25 = pAVar13->u;
                  lVar21 = pAVar13->v;
                  FVar33 = ft_corner_is_flat((long)pAVar13->fx - (long)pAVar13[lVar21].fx,
                                             (long)pAVar13->fy - (long)pAVar13[lVar21].fy,
                                             (long)pAVar13[lVar25].fx - (long)pAVar13->fx,
                                             (long)pAVar13[lVar25].fy - (long)pAVar13->fy);
                  pAVar29 = local_58;
                  if (FVar33 == 0) goto LAB_001801e6;
                  lVar17 = lVar25 * 0x50 + lVar21 * -0x50 >> 4;
                  pAVar13[lVar21].u = lVar17 * -0x3333333333333333;
                  pAVar13[lVar25].v = lVar17 * 0x3333333333333333;
                  uVar9 = pAVar13->flags;
                }
              }
              else if ((int)pAVar13->in_dir + (int)cVar1 != 0) goto LAB_001801e6;
            }
            pAVar13->flags = uVar9 | 0x10;
          }
LAB_001801e6:
          pAVar13 = pAVar13 + 1;
        } while (pAVar13 < pAVar29);
      }
    }
  }
  return local_7c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_glyph_hints_reload( AF_GlyphHints  hints,
                         FT_Outline*    outline )
  {
    FT_Error   error   = FT_Err_Ok;
    AF_Point   points;
    FT_UInt    old_max, new_max;
    FT_Fixed   x_scale = hints->x_scale;
    FT_Fixed   y_scale = hints->y_scale;
    FT_Pos     x_delta = hints->x_delta;
    FT_Pos     y_delta = hints->y_delta;
    FT_Memory  memory  = hints->memory;


    hints->num_points   = 0;
    hints->num_contours = 0;

    hints->axis[0].num_segments = 0;
    hints->axis[0].num_edges    = 0;
    hints->axis[1].num_segments = 0;
    hints->axis[1].num_edges    = 0;

    /* first of all, reallocate the contours array if necessary */
    new_max = (FT_UInt)outline->n_contours;
    old_max = (FT_UInt)hints->max_contours;

    if ( new_max <= AF_CONTOURS_EMBEDDED )
    {
      if ( !hints->contours )
      {
        hints->contours     = hints->embedded.contours;
        hints->max_contours = AF_CONTOURS_EMBEDDED;
      }
    }
    else if ( new_max > old_max )
    {
      if ( hints->contours == hints->embedded.contours )
        hints->contours = NULL;

      new_max = ( new_max + 3 ) & ~3U; /* round up to a multiple of 4 */

      if ( FT_RENEW_ARRAY( hints->contours, old_max, new_max ) )
        goto Exit;

      hints->max_contours = (FT_Int)new_max;
    }

    /*
     *  then reallocate the points arrays if necessary --
     *  note that we reserve two additional point positions, used to
     *  hint metrics appropriately
     */
    new_max = (FT_UInt)( outline->n_points + 2 );
    old_max = (FT_UInt)hints->max_points;

    if ( new_max <= AF_POINTS_EMBEDDED )
    {
      if ( !hints->points )
      {
        hints->points     = hints->embedded.points;
        hints->max_points = AF_POINTS_EMBEDDED;
      }
    }
    else if ( new_max > old_max )
    {
      if ( hints->points == hints->embedded.points )
        hints->points = NULL;

      new_max = ( new_max + 2 + 7 ) & ~7U; /* round up to a multiple of 8 */

      if ( FT_RENEW_ARRAY( hints->points, old_max, new_max ) )
        goto Exit;

      hints->max_points = (FT_Int)new_max;
    }

    hints->num_points   = outline->n_points;
    hints->num_contours = outline->n_contours;

    /* We can't rely on the value of `FT_Outline.flags' to know the fill   */
    /* direction used for a glyph, given that some fonts are broken (e.g., */
    /* the Arphic ones).  We thus recompute it each time we need to.       */
    /*                                                                     */
    hints->axis[AF_DIMENSION_HORZ].major_dir = AF_DIR_UP;
    hints->axis[AF_DIMENSION_VERT].major_dir = AF_DIR_LEFT;

    if ( FT_Outline_Get_Orientation( outline ) == FT_ORIENTATION_POSTSCRIPT )
    {
      hints->axis[AF_DIMENSION_HORZ].major_dir = AF_DIR_DOWN;
      hints->axis[AF_DIMENSION_VERT].major_dir = AF_DIR_RIGHT;
    }

    hints->x_scale = x_scale;
    hints->y_scale = y_scale;
    hints->x_delta = x_delta;
    hints->y_delta = y_delta;

    hints->xmin_delta = 0;
    hints->xmax_delta = 0;

    points = hints->points;
    if ( hints->num_points == 0 )
      goto Exit;

    {
      AF_Point  point;
      AF_Point  point_limit = points + hints->num_points;

      /* value 20 in `near_limit' is heuristic */
      FT_UInt  units_per_em = hints->metrics->scaler.face->units_per_EM;
      FT_Int   near_limit   = 20 * units_per_em / 2048;


      /* compute coordinates & Bezier flags, next and prev */
      {
        FT_Vector*  vec           = outline->points;
        char*       tag           = outline->tags;
        FT_Short    endpoint      = outline->contours[0];
        AF_Point    end           = points + endpoint;
        AF_Point    prev          = end;
        FT_Int      contour_index = 0;


        for ( point = points; point < point_limit; point++, vec++, tag++ )
        {
          FT_Pos  out_x, out_y;


          point->in_dir  = (FT_Char)AF_DIR_NONE;
          point->out_dir = (FT_Char)AF_DIR_NONE;

          point->fx = (FT_Short)vec->x;
          point->fy = (FT_Short)vec->y;
          point->ox = point->x = FT_MulFix( vec->x, x_scale ) + x_delta;
          point->oy = point->y = FT_MulFix( vec->y, y_scale ) + y_delta;

          end->fx = (FT_Short)outline->points[endpoint].x;
          end->fy = (FT_Short)outline->points[endpoint].y;

          switch ( FT_CURVE_TAG( *tag ) )
          {
          case FT_CURVE_TAG_CONIC:
            point->flags = AF_FLAG_CONIC;
            break;
          case FT_CURVE_TAG_CUBIC:
            point->flags = AF_FLAG_CUBIC;
            break;
          default:
            point->flags = AF_FLAG_NONE;
          }

          out_x = point->fx - prev->fx;
          out_y = point->fy - prev->fy;

          if ( FT_ABS( out_x ) + FT_ABS( out_y ) < near_limit )
            prev->flags |= AF_FLAG_NEAR;

          point->prev = prev;
          prev->next  = point;
          prev        = point;

          if ( point == end )
          {
            if ( ++contour_index < outline->n_contours )
            {
              endpoint = outline->contours[contour_index];
              end      = points + endpoint;
              prev     = end;
            }
          }
        }
      }

      /* set up the contours array */
      {
        AF_Point*  contour       = hints->contours;
        AF_Point*  contour_limit = contour + hints->num_contours;
        short*     end           = outline->contours;
        short      idx           = 0;


        for ( ; contour < contour_limit; contour++, end++ )
        {
          contour[0] = points + idx;
          idx        = (short)( end[0] + 1 );
        }
      }

      {
        /*
         *  Compute directions of `in' and `out' vectors.
         *
         *  Note that distances between points that are very near to each
         *  other are accumulated.  In other words, the auto-hinter either
         *  prepends the small vectors between near points to the first
         *  non-near vector, or the sum of small vector lengths exceeds a
         *  threshold, thus `grouping' the small vectors.  All intermediate
         *  points are tagged as weak; the directions are adjusted also to
         *  be equal to the accumulated one.
         */

        FT_Int  near_limit2 = 2 * near_limit - 1;

        AF_Point*  contour;
        AF_Point*  contour_limit = hints->contours + hints->num_contours;


        for ( contour = hints->contours; contour < contour_limit; contour++ )
        {
          AF_Point  first = *contour;
          AF_Point  next, prev, curr;

          FT_Pos  out_x, out_y;


          /* since the first point of a contour could be part of a */
          /* series of near points, go backwards to find the first */
          /* non-near point and adjust `first'                     */

          point = first;
          prev  = first->prev;

          while ( prev != first )
          {
            out_x = point->fx - prev->fx;
            out_y = point->fy - prev->fy;

            /*
             *  We use Taxicab metrics to measure the vector length.
             *
             *  Note that the accumulated distances so far could have the
             *  opposite direction of the distance measured here.  For this
             *  reason we use `near_limit2' for the comparison to get a
             *  non-near point even in the worst case.
             */
            if ( FT_ABS( out_x ) + FT_ABS( out_y ) >= near_limit2 )
              break;

            point = prev;
            prev  = prev->prev;
          }

          /* adjust first point */
          first = point;

          /* now loop over all points of the contour to get */
          /* `in' and `out' vector directions               */

          curr = first;

          /*
           *  We abuse the `u' and `v' fields to store index deltas to the
           *  next and previous non-near point, respectively.
           *
           *  To avoid problems with not having non-near points, we point to
           *  `first' by default as the next non-near point.
           *
           */
          curr->u  = (FT_Pos)( first - curr );
          first->v = -curr->u;

          out_x = 0;
          out_y = 0;

          next = first;
          do
          {
            AF_Direction  out_dir;


            point = next;
            next  = point->next;

            out_x += next->fx - point->fx;
            out_y += next->fy - point->fy;

            if ( FT_ABS( out_x ) + FT_ABS( out_y ) < near_limit )
            {
              next->flags |= AF_FLAG_WEAK_INTERPOLATION;
              continue;
            }

            curr->u = (FT_Pos)( next - curr );
            next->v = -curr->u;

            out_dir = af_direction_compute( out_x, out_y );

            /* adjust directions for all points inbetween; */
            /* the loop also updates position of `curr'    */
            curr->out_dir = (FT_Char)out_dir;
            for ( curr = curr->next; curr != next; curr = curr->next )
            {
              curr->in_dir  = (FT_Char)out_dir;
              curr->out_dir = (FT_Char)out_dir;
            }
            next->in_dir = (FT_Char)out_dir;

            curr->u  = (FT_Pos)( first - curr );
            first->v = -curr->u;

            out_x = 0;
            out_y = 0;

          } while ( next != first );
        }

        /*
         *  The next step is to `simplify' an outline's topology so that we
         *  can identify local extrema more reliably: A series of
         *  non-horizontal or non-vertical vectors pointing into the same
         *  quadrant are handled as a single, long vector.  From a
         *  topological point of the view, the intermediate points are of no
         *  interest and thus tagged as weak.
         */

        for ( point = points; point < point_limit; point++ )
        {
          if ( point->flags & AF_FLAG_WEAK_INTERPOLATION )
            continue;

          if ( point->in_dir  == AF_DIR_NONE &&
               point->out_dir == AF_DIR_NONE )
          {
            /* check whether both vectors point into the same quadrant */

            FT_Pos  in_x, in_y;
            FT_Pos  out_x, out_y;

            AF_Point  next_u = point + point->u;
            AF_Point  prev_v = point + point->v;


            in_x = point->fx - prev_v->fx;
            in_y = point->fy - prev_v->fy;

            out_x = next_u->fx - point->fx;
            out_y = next_u->fy - point->fy;

            if ( ( in_x ^ out_x ) >= 0 && ( in_y ^ out_y ) >= 0 )
            {
              /* yes, so tag current point as weak */
              /* and update index deltas           */

              point->flags |= AF_FLAG_WEAK_INTERPOLATION;

              prev_v->u = (FT_Pos)( next_u - prev_v );
              next_u->v = -prev_v->u;
            }
          }
        }

        /*
         *  Finally, check for remaining weak points.  Everything else not
         *  collected in edges so far is then implicitly classified as strong
         *  points.
         */

        for ( point = points; point < point_limit; point++ )
        {
          if ( point->flags & AF_FLAG_WEAK_INTERPOLATION )
            continue;

          if ( point->flags & AF_FLAG_CONTROL )
          {
            /* control points are always weak */
          Is_Weak_Point:
            point->flags |= AF_FLAG_WEAK_INTERPOLATION;
          }
          else if ( point->out_dir == point->in_dir )
          {
            if ( point->out_dir != AF_DIR_NONE )
            {
              /* current point lies on a horizontal or          */
              /* vertical segment (but doesn't start or end it) */
              goto Is_Weak_Point;
            }

            {
              AF_Point  next_u = point + point->u;
              AF_Point  prev_v = point + point->v;


              if ( ft_corner_is_flat( point->fx  - prev_v->fx,
                                      point->fy  - prev_v->fy,
                                      next_u->fx - point->fx,
                                      next_u->fy - point->fy ) )
              {
                /* either the `in' or the `out' vector is much more  */
                /* dominant than the other one, so tag current point */
                /* as weak and update index deltas                   */

                prev_v->u = (FT_Pos)( next_u - prev_v );
                next_u->v = -prev_v->u;

                goto Is_Weak_Point;
              }
            }
          }
          else if ( point->in_dir == -point->out_dir )
          {
            /* current point forms a spike */
            goto Is_Weak_Point;
          }
        }
      }
    }

  Exit:
    return error;
  }